

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_prov_cipher.c
# Opt level: O0

int cipher_encrypt_init(void *vgctx,uchar *key,size_t keylen,uchar *iv,size_t ivlen,
                       OSSL_PARAM *params)

{
  int iVar1;
  uchar *in_RCX;
  ulong in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  ulong in_R8;
  GOST_CTX *gctx;
  OSSL_PARAM *in_stack_00000400;
  void *in_stack_00000408;
  
  iVar1 = cipher_set_ctx_params(in_stack_00000408,in_stack_00000400);
  if (((iVar1 != 0) && (iVar1 = EVP_CIPHER_get_key_length(in_RDI[3]), in_RDX <= (ulong)(long)iVar1))
     && (iVar1 = EVP_CIPHER_get_iv_length(in_RDI[3]), in_R8 <= (ulong)(long)iVar1)) {
    iVar1 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)in_RDI[4],(EVP_CIPHER *)in_RDI[3],
                              *(ENGINE **)(*in_RDI + 0x18),in_RSI,in_RCX,1);
    return iVar1;
  }
  return 0;
}

Assistant:

static int cipher_encrypt_init(void *vgctx,
                               const unsigned char *key, size_t keylen,
                               const unsigned char *iv, size_t ivlen,
                               const OSSL_PARAM params[])
{
    GOST_CTX *gctx = vgctx;

    if (!cipher_set_ctx_params(vgctx, params)
        || keylen > EVP_CIPHER_key_length(gctx->cipher)
        || ivlen > EVP_CIPHER_iv_length(gctx->cipher))
        return 0;

    return EVP_CipherInit_ex(gctx->cctx, gctx->cipher, gctx->provctx->e,
                             key, iv, 1);
}